

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatmain.c
# Opt level: O3

int ecx_send_processdata_group(ecx_contextt *context,uint8 group)

{
  byte bVar1;
  ec_idxstackT *peVar2;
  uint uVar3;
  int iVar4;
  uint32 uVar5;
  uint8 uVar6;
  ulong uVar7;
  ulong uVar8;
  ushort uVar9;
  undefined7 in_register_00000031;
  ulong uVar10;
  ec_groupt *peVar11;
  int iVar12;
  uint32 uVar13;
  uint8 *data;
  void *data_00;
  uint uVar14;
  uint32 uVar15;
  bool bVar16;
  uint16 uVar17;
  uint8 *local_60;
  
  peVar11 = context->grouplist;
  uVar7 = CONCAT71(in_register_00000031,group) & 0xffffffff;
  bVar16 = peVar11[uVar7].hasdc == '\0';
  uVar13 = peVar11[uVar7].Obytes;
  uVar5 = peVar11[uVar7].Ibytes;
  iVar12 = uVar5 + uVar13;
  if (iVar12 == 0) {
    iVar4 = 0;
  }
  else {
    uVar15 = peVar11[uVar7].logstartaddr;
    if (group == '\0') {
      peVar2 = context->idxstack;
      peVar2->pushed = '\0';
      peVar2->pulled = '\0';
    }
    if (peVar11[uVar7].blockLRW == '\0') {
      data_00 = *(void **)(peVar11[uVar7].IOsegment + (ulong)(uVar13 == 0) * 4 + -0xb);
      uVar10 = 0;
      do {
        uVar13 = peVar11[uVar7].IOsegment[uVar10];
        uVar3 = ecx_getindex(context->port);
        uVar14 = uVar3 & 0xff;
        uVar17 = (uint16)uVar13;
        uVar6 = (uint8)uVar3;
        ecx_setupdatagram(context->port,context->port->txbuf + uVar14,'\f',uVar6,(uint16)uVar15,
                          (uint16)(uVar15 >> 0x10),uVar17,data_00);
        if (!bVar16) {
          context->DCl = uVar17;
          iVar4 = ecx_adddatagram(context->port,context->port->txbuf + uVar14,'\x0e',uVar6,'\0',
                                  context->slavelist[context->grouplist[uVar7].DCnext].configadr,
                                  0x910,8,context->DCtime);
          context->DCtO = (uint16)iVar4;
        }
        ecx_outframe_red(context->port,uVar14);
        uVar8 = (ulong)context->idxstack->pushed;
        if (uVar8 < 0x10) {
          context->idxstack->idx[uVar8] = uVar6;
          context->idxstack->data[context->idxstack->pushed] = data_00;
          peVar2 = context->idxstack;
          bVar1 = peVar2->pushed;
          peVar2->length[bVar1] = uVar17;
          peVar2->pushed = bVar1 + 1;
        }
        iVar4 = 1;
        iVar12 = iVar12 - uVar13;
        if (iVar12 == 0) {
          return 1;
        }
        uVar10 = uVar10 + 1;
        data_00 = (void *)((long)data_00 + (long)(int)uVar13);
        uVar15 = uVar15 + uVar13;
        peVar11 = context->grouplist;
        bVar16 = true;
      } while (uVar10 < peVar11[uVar7].nsegments);
    }
    else {
      if (uVar5 != 0) {
        uVar9 = peVar11[uVar7].Isegment;
        local_60 = peVar11[uVar7].inputs;
        iVar12 = uVar15 + uVar13;
        do {
          uVar13 = peVar11[uVar7].IOsegment[uVar9];
          if (uVar9 == peVar11[uVar7].Isegment) {
            uVar13 = uVar13 - peVar11[uVar7].Ioffset;
          }
          uVar3 = ecx_getindex(context->port);
          uVar14 = uVar3 & 0xff;
          uVar17 = (uint16)uVar13;
          uVar6 = (uint8)uVar3;
          ecx_setupdatagram(context->port,context->port->txbuf + uVar14,'\n',uVar6,(uint16)iVar12,
                            (uint16)((uint)iVar12 >> 0x10),uVar17,local_60);
          if (!bVar16) {
            context->DCl = uVar17;
            iVar4 = ecx_adddatagram(context->port,context->port->txbuf + uVar14,'\x0e',uVar6,'\0',
                                    context->slavelist[context->grouplist[uVar7].DCnext].configadr,
                                    0x910,8,context->DCtime);
            context->DCtO = (uint16)iVar4;
          }
          ecx_outframe_red(context->port,uVar14);
          uVar10 = (ulong)context->idxstack->pushed;
          if (uVar10 < 0x10) {
            context->idxstack->idx[uVar10] = uVar6;
            context->idxstack->data[context->idxstack->pushed] = local_60;
            peVar2 = context->idxstack;
            bVar1 = peVar2->pushed;
            peVar2->length[bVar1] = uVar17;
            peVar2->pushed = bVar1 + 1;
          }
          peVar11 = context->grouplist;
          uVar5 = uVar5 - uVar13;
          if (uVar5 == 0) break;
          uVar9 = uVar9 + 1;
          local_60 = local_60 + (int)uVar13;
          iVar12 = iVar12 + uVar13;
          bVar16 = true;
        } while (uVar9 < peVar11[uVar7].nsegments);
        uVar13 = peVar11[uVar7].Obytes;
        bVar16 = true;
      }
      iVar4 = 1;
      if (uVar13 != 0) {
        data = peVar11[uVar7].outputs;
        uVar5 = peVar11[uVar7].logstartaddr;
        uVar10 = 0;
        do {
          uVar15 = peVar11[uVar7].IOsegment[uVar10];
          if ((int)uVar13 < (int)peVar11[uVar7].IOsegment[uVar10]) {
            uVar15 = uVar13;
          }
          uVar3 = ecx_getindex(context->port);
          uVar14 = uVar3 & 0xff;
          uVar17 = (uint16)uVar15;
          uVar6 = (uint8)uVar3;
          ecx_setupdatagram(context->port,context->port->txbuf + uVar14,'\v',uVar6,(uint16)uVar5,
                            (uint16)(uVar5 >> 0x10),uVar17,data);
          if (!bVar16) {
            context->DCl = uVar17;
            iVar12 = ecx_adddatagram(context->port,context->port->txbuf + uVar14,'\x0e',uVar6,'\0',
                                     context->slavelist[context->grouplist[uVar7].DCnext].configadr,
                                     0x910,8,context->DCtime);
            context->DCtO = (uint16)iVar12;
          }
          ecx_outframe_red(context->port,uVar14);
          uVar8 = (ulong)context->idxstack->pushed;
          if (uVar8 < 0x10) {
            context->idxstack->idx[uVar8] = uVar6;
            context->idxstack->data[context->idxstack->pushed] = data;
            peVar2 = context->idxstack;
            bVar1 = peVar2->pushed;
            peVar2->length[bVar1] = uVar17;
            peVar2->pushed = bVar1 + 1;
          }
          uVar13 = uVar13 - uVar15;
          if (uVar13 == 0) break;
          uVar10 = uVar10 + 1;
          data = data + (int)uVar15;
          uVar5 = uVar5 + uVar15;
          peVar11 = context->grouplist;
          bVar16 = true;
        } while (uVar10 < peVar11[uVar7].nsegments);
        iVar4 = 1;
      }
    }
  }
  return iVar4;
}

Assistant:

int ecx_send_processdata_group(ecx_contextt *context, uint8 group)
{
   uint32 LogAdr;
   uint16 w1, w2;
   int length, sublength;
   uint8 idx;
   int wkc;
   uint8* data;
   boolean first=FALSE;
   uint16 currentsegment = 0;

   wkc = 0;
   if(context->grouplist[group].hasdc)
   {
      first = TRUE;
   }
   length = context->grouplist[group].Obytes + context->grouplist[group].Ibytes;
   LogAdr = context->grouplist[group].logstartaddr;
   if (length)
   {
      if(!group)
      {
         context->idxstack->pushed = 0;
         context->idxstack->pulled = 0;
      }
      wkc = 1;
      /* LRW blocked by one or more slaves ? */
      if (context->grouplist[group].blockLRW)
      {
         /* if inputs available generate LRD */
         if(context->grouplist[group].Ibytes)
         {
            currentsegment = context->grouplist[group].Isegment;
            data = context->grouplist[group].inputs;
            length = context->grouplist[group].Ibytes;
            LogAdr += context->grouplist[group].Obytes;
            /* segment transfer if needed */
            do
            {
               if(currentsegment == context->grouplist[group].Isegment)
               {
                  sublength = context->grouplist[group].IOsegment[currentsegment++] - context->grouplist[group].Ioffset;
               }
               else
               {
                  sublength = context->grouplist[group].IOsegment[currentsegment++];
               }
               /* get new index */
               idx = ecx_getindex(context->port);
               w1 = LO_WORD(LogAdr);
               w2 = HI_WORD(LogAdr);
               ecx_setupdatagram(context->port, &(context->port->txbuf[idx]), EC_CMD_LRD, idx, w1, w2, sublength, data);
               if(first)
               {
                  context->DCl = sublength;
                  /* FPRMW in second datagram */
                  context->DCtO = ecx_adddatagram(context->port, &(context->port->txbuf[idx]), EC_CMD_FRMW, idx, FALSE,
                                           context->slavelist[context->grouplist[group].DCnext].configadr,
                                           ECT_REG_DCSYSTIME, sizeof(context->DCtime), context->DCtime);
                  first = FALSE;
               }
               /* send frame */
               ecx_outframe_red(context->port, idx);
               /* push index and data pointer on stack */
               ecx_pushindex(context, idx, data, sublength);
               length -= sublength;
               LogAdr += sublength;
               data += sublength;
            } while (length && (currentsegment < context->grouplist[group].nsegments));
         }
         /* if outputs available generate LWR */
         if(context->grouplist[group].Obytes)
         {
            data = context->grouplist[group].outputs;
            length = context->grouplist[group].Obytes;
            LogAdr = context->grouplist[group].logstartaddr;
            currentsegment = 0;
            /* segment transfer if needed */
            do
            {
               sublength = context->grouplist[group].IOsegment[currentsegment++];
               if((length - sublength) < 0)
               {
                  sublength = length;
               }
               /* get new index */
               idx = ecx_getindex(context->port);
               w1 = LO_WORD(LogAdr);
               w2 = HI_WORD(LogAdr);
               ecx_setupdatagram(context->port, &(context->port->txbuf[idx]), EC_CMD_LWR, idx, w1, w2, sublength, data);
               if(first)
               {
                  context->DCl = sublength;
                  /* FPRMW in second datagram */
                  context->DCtO = ecx_adddatagram(context->port, &(context->port->txbuf[idx]), EC_CMD_FRMW, idx, FALSE,
                                           context->slavelist[context->grouplist[group].DCnext].configadr,
                                           ECT_REG_DCSYSTIME, sizeof(context->DCtime), context->DCtime);
                  first = FALSE;
               }
               /* send frame */
               ecx_outframe_red(context->port, idx);
               /* push index and data pointer on stack */
               ecx_pushindex(context, idx, data, sublength);
               length -= sublength;
               LogAdr += sublength;
               data += sublength;
            } while (length && (currentsegment < context->grouplist[group].nsegments));
         }
      }
      /* LRW can be used */
      else
      {
         if (context->grouplist[group].Obytes)
         {
            data = context->grouplist[group].outputs;
         }
         else
         {
            data = context->grouplist[group].inputs;
         }
         /* segment transfer if needed */
         do
         {
            sublength = context->grouplist[group].IOsegment[currentsegment++];
            /* get new index */
            idx = ecx_getindex(context->port);
            w1 = LO_WORD(LogAdr);
            w2 = HI_WORD(LogAdr);
            ecx_setupdatagram(context->port, &(context->port->txbuf[idx]), EC_CMD_LRW, idx, w1, w2, sublength, data);
            if(first)
            {
               context->DCl = sublength;
               /* FPRMW in second datagram */
               context->DCtO = ecx_adddatagram(context->port, &(context->port->txbuf[idx]), EC_CMD_FRMW, idx, FALSE,
                                        context->slavelist[context->grouplist[group].DCnext].configadr,
                                        ECT_REG_DCSYSTIME, sizeof(context->DCtime), context->DCtime);
               first = FALSE;
            }
            /* send frame */
            ecx_outframe_red(context->port, idx);
            /* push index and data pointer on stack */
            ecx_pushindex(context, idx, data, sublength);
            length -= sublength;
            LogAdr += sublength;
            data += sublength;
         } while (length && (currentsegment < context->grouplist[group].nsegments));
      }
   }

   return wkc;
}